

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

int raviX_ptrlist_linearize(PtrList *head,void **arr,int max)

{
  int local_2c;
  PtrList *pPStack_28;
  int i;
  PtrList *list;
  int nr;
  int max_local;
  void **arr_local;
  PtrList *head_local;
  
  list._0_4_ = 0;
  if ((head != (PtrList *)0x0) && (pPStack_28 = head, list._4_4_ = max, _nr = arr, 0 < max)) {
    do {
      local_2c = (int)(short)(char)*(undefined2 *)pPStack_28;
      if (list._4_4_ < local_2c) {
        local_2c = list._4_4_;
      }
      memcpy(_nr,pPStack_28->list_,(long)local_2c << 3);
      _nr = _nr + local_2c;
      list._0_4_ = local_2c + (int)list;
      list._4_4_ = list._4_4_ - local_2c;
    } while ((list._4_4_ != 0) && (pPStack_28 = pPStack_28->next_, pPStack_28 != head));
  }
  return (int)list;
}

Assistant:

int raviX_ptrlist_linearize(PtrList *head, void **arr, int max)
{
	int nr = 0;
	if (head && max > 0) {
		PtrList *list = head;

		do {
			int i = list->nr_;
			if (i > max)
				i = max;
			memcpy(arr, list->list_, i * sizeof(void *));
			arr += i;
			nr += i;
			max -= i;
			if (!max)
				break;
		} while ((list = list->next_) != head);
	}
	return nr;
}